

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::SetScriptModeFile(cmMakefile *this,string *scriptfile)

{
  string_view value;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CMAKE_SCRIPT_MODE_FILE",&local_39);
  value._M_str = (scriptfile->_M_dataplus)._M_p;
  value._M_len = scriptfile->_M_string_length;
  AddDefinition(this,&local_38,value);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void cmMakefile::SetScriptModeFile(std::string const& scriptfile)
{
  this->AddDefinition("CMAKE_SCRIPT_MODE_FILE", scriptfile);
}